

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi_lmo3.cpp
# Opt level: O3

int64_t primesum::pi_lmo3(int64_t x)

{
  int iVar1;
  int iVar2;
  undefined1 x_00 [16];
  undefined1 x_01 [16];
  undefined1 x_02 [16];
  int *piVar3;
  int *piVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  int64_t iVar13;
  int64_t m;
  int128_t *__n;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  int128_t *piVar18;
  int *piVar19;
  bool bVar20;
  double dVar21;
  double dVar22;
  vector<int,_std::allocator<int>_> primes;
  vector<char,_std::allocator<char>_> sieve;
  vector<long,_std::allocator<long>_> next;
  vector<int,_std::allocator<int>_> lpf;
  vector<int,_std::allocator<int>_> mu;
  vector<long,_std::allocator<long>_> phi;
  int256_t s1;
  int256_t p2;
  undefined8 in_stack_fffffffffffffe78;
  undefined8 in_stack_fffffffffffffe80;
  size_type __n_00;
  vector<int,_std::allocator<int>_> local_170;
  long local_158;
  vector<char,_std::allocator<char>_> local_150;
  long local_138;
  int128_t *local_130;
  void *local_128 [2];
  long local_118;
  long local_110;
  long local_108;
  long local_100;
  long local_f8;
  long local_f0;
  long local_e8;
  long local_e0;
  long local_d8;
  pointer local_d0;
  vector<int,_std::allocator<int>_> local_c8;
  vector<int,_std::allocator<int>_> local_b0;
  vector<long,_std::allocator<long>_> local_98;
  value_type_conflict7 local_80;
  int256_t local_78;
  int256_t local_58;
  
  if (x < 2) {
    iVar13 = 0;
  }
  else {
    x_00._8_8_ = in_stack_fffffffffffffe80;
    x_00._0_8_ = in_stack_fffffffffffffe78;
    dVar21 = get_alpha_lmo((primesum *)x,(int128_t)x_00);
    dVar22 = pow((double)x,0.3333333333333333);
    lVar8 = (long)dVar22;
    if (0 < lVar8) {
      do {
        if (lVar8 * lVar8 - x / lVar8 == 0 || lVar8 * lVar8 < x / lVar8) goto LAB_0011f8ea;
        bVar20 = 1 < lVar8;
        lVar8 = lVar8 + -1;
      } while (bVar20);
      lVar8 = 0;
    }
LAB_0011f8ea:
    lVar8 = lVar8 + -1;
    do {
      lVar16 = lVar8 + 2;
      lVar8 = lVar8 + 1;
    } while (lVar16 * lVar16 - x / lVar16 == 0 || lVar16 * lVar16 < x / lVar16);
    piVar18 = (int128_t *)(long)(dVar21 * (double)lVar8);
    lVar8 = 6;
    if ((long)piVar18 < 0xd) {
      lVar8 = (long)(int)(&PhiTiny::pi)[(long)piVar18];
    }
    x_01._8_8_ = in_stack_fffffffffffffe80;
    x_01._0_8_ = in_stack_fffffffffffffe78;
    P2(&local_58,(primesum *)x,(int128_t)x_01,0,(int)piVar18);
    generate_moebius(&local_b0,(int64_t)piVar18);
    generate_lpf(&local_c8,(int64_t)piVar18);
    generate_primes(&local_170,(int64_t)piVar18);
    x_02._8_8_ = in_stack_fffffffffffffe80;
    x_02._0_8_ = in_stack_fffffffffffffe78;
    S1(&local_78,(primesum *)x,(int128_t)x_02,0,(int64_t)piVar18,(int)lVar8);
    local_138 = x / (long)piVar18;
    local_108 = local_138 + 1;
    dVar21 = (double)local_108;
    if (dVar21 < 0.0) {
      dVar21 = sqrt(dVar21);
    }
    else {
      dVar21 = SQRT(dVar21);
    }
    lVar16 = 0xb504f333;
    if ((long)dVar21 < 0xb504f333) {
      lVar16 = (long)dVar21;
    }
    lVar9 = lVar16 * 2;
    do {
      lVar11 = lVar16 * lVar16;
      lVar9 = lVar9 + -2;
      lVar17 = lVar16;
      lVar16 = lVar16 + -1;
    } while (lVar11 - local_108 != 0 && local_108 <= lVar11);
    do {
      lVar16 = lVar17;
      lVar9 = lVar9 + 2;
      lVar17 = lVar16 + 1;
    } while (lVar9 < local_108 - lVar16 * lVar16);
    __n_00 = 1;
    if (lVar16 + 1 != 1) {
      uVar5 = lVar16 - 1;
      lVar16 = 1;
      do {
        uVar5 = (long)uVar5 >> ((byte)lVar16 & 0x3f) | uVar5;
        bVar20 = lVar16 < 0x20;
        lVar16 = lVar16 * 2;
      } while (bVar20);
      __n_00 = uVar5 + 1;
    }
    piVar19 = local_170.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start + 1;
    piVar4 = piVar19;
    uVar5 = (long)local_170.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)piVar19 >> 2;
    while (piVar3 = piVar4, 0 < (long)uVar5) {
      uVar12 = uVar5 >> 1;
      piVar4 = piVar3 + uVar12 + 1;
      uVar5 = ~uVar12 + uVar5;
      if ((long)piVar18 < (long)piVar3[uVar12]) {
        piVar4 = piVar3;
        uVar5 = uVar12;
      }
    }
    std::vector<char,_std::allocator<char>_>::vector(&local_150,__n_00,(allocator_type *)local_128);
    std::vector<long,std::allocator<long>>::
    vector<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
              ((vector<long,std::allocator<long>> *)local_128,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               local_170.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               local_170.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,(allocator_type *)&local_98);
    __n = (int128_t *)
          ((long)local_170.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_170.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start >> 2);
    local_80 = 0;
    std::vector<long,_std::allocator<long>_>::vector
              (&local_98,(size_type)__n,&local_80,(allocator_type *)&stack0xfffffffffffffe7f);
    if (local_138 < 1) {
      local_158 = 0;
    }
    else {
      lVar16 = (long)piVar3 - (long)piVar19 >> 2;
      local_110 = lVar8 + 1;
      lVar17 = -1;
      local_158 = 0;
      lVar9 = 1;
      local_130 = piVar18;
      local_f8 = lVar16;
      local_f0 = lVar8;
      local_d8 = x;
      do {
        if (local_150.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start !=
            local_150.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          __n = (int128_t *)0x1;
          memset(local_150.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start,1,
                 (long)local_150.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)local_150.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start);
        }
        local_100 = lVar9 + __n_00;
        lVar11 = local_100;
        if (local_108 < local_100) {
          lVar11 = local_108;
        }
        if (0 < lVar8) {
          lVar14 = 1;
          do {
            lVar10 = *(long *)((long)local_128[0] + lVar14 * 8);
            if (lVar10 < lVar11) {
              iVar1 = local_170.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar14];
              do {
                __n = (int128_t *)
                      (local_150.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar17);
                *(undefined1 *)(lVar10 + (long)__n) = 0;
                lVar10 = lVar10 + iVar1;
              } while (lVar10 < lVar11);
            }
            *(long *)((long)local_128[0] + lVar14 * 8) = lVar10;
            bVar20 = lVar14 != lVar8;
            lVar14 = lVar14 + 1;
          } while (bVar20);
        }
        if (local_110 < lVar16) {
          local_e8 = lVar11 - lVar9;
          lVar14 = local_110;
          do {
            iVar1 = local_170.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar14];
            lVar15 = (long)iVar1;
            lVar6 = x / (lVar11 * lVar15);
            lVar10 = (long)piVar18 / lVar15;
            if ((long)piVar18 / lVar15 < lVar6) {
              lVar10 = lVar6;
            }
            __n = (int128_t *)(x / (lVar9 * lVar15));
            if ((long)piVar18 <= (long)__n) {
              __n = piVar18;
            }
            local_e0 = lVar17;
            if ((long)__n <= lVar15) break;
            if (lVar10 < (long)__n) {
              lVar8 = 0;
              local_d0 = local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start;
              do {
                iVar2 = local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[(long)__n];
                if (((long)iVar2 != 0) &&
                   (iVar1 < local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[(long)__n])) {
                  lVar7 = x / ((long)__n * lVar15) - lVar9;
                  lVar16 = local_98.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar14];
                  lVar6 = lVar8;
                  if (lVar8 <= lVar7) {
                    do {
                      lVar16 = lVar16 + (long)local_150.
                                              super__Vector_base<char,_std::allocator<char>_>.
                                              _M_impl.super__Vector_impl_data._M_start[lVar6] *
                                        (lVar9 + lVar6);
                      local_98.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar14] = lVar16;
                      lVar8 = lVar6 + 1;
                      bVar20 = lVar6 < lVar7;
                      lVar6 = lVar8;
                    } while (bVar20);
                  }
                  local_158 = local_158 - (long)__n * lVar15 * (long)iVar2 * lVar16;
                  x = local_d8;
                }
                __n = (int128_t *)((long)__n - 1);
              } while (lVar10 < (long)__n);
            }
            else {
              lVar8 = 0;
            }
            if (lVar8 < local_e8) {
              lVar16 = local_98.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar14];
              do {
                __n = (int128_t *)(lVar9 + lVar8);
                lVar16 = lVar16 + (long)local_150.super__Vector_base<char,_std::allocator<char>_>.
                                        _M_impl.super__Vector_impl_data._M_start[lVar8] * (long)__n;
                local_98.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_start[lVar14] = lVar16;
                lVar8 = lVar8 + 1;
              } while (lVar8 < local_e8);
            }
            lVar8 = *(long *)((long)local_128[0] + lVar14 * 8);
            if (lVar8 < lVar11) {
              do {
                local_150.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start[lVar8 + lVar17] = '\0';
                lVar8 = lVar8 + lVar15 * 2;
              } while (lVar8 < lVar11);
            }
            *(long *)((long)local_128[0] + lVar14 * 8) = lVar8;
            lVar14 = lVar14 + 1;
            lVar8 = local_f0;
            lVar16 = local_f8;
            piVar18 = local_130;
          } while (lVar14 != local_f8);
        }
        lVar17 = lVar17 - __n_00;
        lVar9 = local_100;
      } while (local_100 <= local_138);
    }
    if (local_98.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      __n = (int128_t *)
            ((long)local_98.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage -
            (long)local_98.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_start);
      operator_delete(local_98.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start,(ulong)__n);
    }
    if (local_128[0] != (void *)0x0) {
      __n = (int128_t *)(local_118 - (long)local_128[0]);
      operator_delete(local_128[0],(ulong)__n);
    }
    if (local_150.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      __n = (int128_t *)
            (local_150.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage +
            -(long)local_150.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start);
      operator_delete(local_150.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,(ulong)__n);
    }
    piVar18 = prime_sum_tiny(piVar18,(int64_t)__n);
    if (local_170.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (int *)0x0) {
      operator_delete(local_170.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_170.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_170.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    lVar8 = (long)local_78.low + local_158;
    if (local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    iVar13 = (long)piVar18 + ~(ulong)local_58.low + lVar8;
  }
  return iVar13;
}

Assistant:

int64_t pi_lmo3(int64_t x)
{
  if (x < 2)
    return 0;

  double alpha = get_alpha_lmo(x);
  int64_t x13 = iroot<3>(x);
  int64_t y = (int64_t) (x13 * alpha);
  int64_t c = PhiTiny::get_c(y);
  int256_t p2 = P2(x, y, 1);

  vector<int32_t> mu = generate_moebius(y);
  vector<int32_t> lpf = generate_lpf(y);
  vector<int32_t> primes = generate_primes(y);

  int256_t s1 = S1(x, y, c, 1);
  int256_t s2 = S2(x, y, c, primes, lpf, mu);
  int256_t phi = s1 + s2;
  int256_t sum = phi + prime_sum_tiny(y) - 1 - p2;

  return int64_t(sum);
}